

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.c
# Opt level: O3

sexp sexp_bignum_sqrt_estimate(sexp ctx,sexp a)

{
  ulong uVar1;
  sexp psVar2;
  uint uVar3;
  sexp_uint_t sVar4;
  uint uVar5;
  int iVar6;
  sexp local_38;
  sexp_gc_var_t local_30;
  
  local_30.var = &local_38;
  sVar4 = (a->value).string.offset;
  iVar6 = (int)sVar4 * 0x40 + 1;
  do {
    if (sVar4 == 1) {
      uVar1 = (a->value).string.length;
      iVar6 = 1;
      break;
    }
    uVar1 = *(ulong *)((long)&a->value + sVar4 * 8 + 8);
    iVar6 = iVar6 + -0x40;
    sVar4 = sVar4 - 1;
  } while (uVar1 == 0);
  local_38 = (sexp)0x43e;
  uVar3 = 0x40;
  do {
    uVar5 = uVar3 - 1;
    uVar3 = uVar3 - 1;
    if ((uVar1 >> ((ulong)(uVar5 & 0xff) & 0x3f) & 1) != 0) goto LAB_0011b427;
  } while (1 < uVar3);
  uVar3 = 0;
LAB_0011b427:
  local_30.next = (ctx->value).context.saves;
  (ctx->value).context.saves = &local_30;
  local_38 = sexp_fixnum_to_bignum(ctx,(sexp)&DAT_00000005);
  psVar2 = sexp_bignum_expt(ctx,local_38,(sexp)((long)((int)(iVar6 + uVar3) / 2) * 2 + 1));
  (ctx->value).context.saves = local_30.next;
  return psVar2;
}

Assistant:

sexp sexp_bignum_sqrt_estimate (sexp ctx, sexp a) {
  sexp_uint_t alen=sexp_bignum_hi(a), adata_hi;
  int nbits, i;
  sexp_gc_var1(res);

  adata_hi = sexp_bignum_data(a)[alen - 1];
  for (i = sizeof(sexp_uint_t)*8-1; i > 0; i--)
    if (adata_hi & (1ul << i))
      break;
  nbits = sizeof(sexp_uint_t) * 8 * (alen - 1) + i + 1;

  sexp_gc_preserve1(ctx, res);
  res = sexp_fixnum_to_bignum(ctx, SEXP_TWO);
  res = sexp_bignum_expt(ctx, res, sexp_make_fixnum(nbits / 2));
  sexp_gc_release1(ctx);
  return res;
}